

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

problem * __thiscall
anon_unknown.dwarf_132a07::preprocessor<baryonyx::raw_problem>::make_problem
          (problem *__return_storage_ptr__,preprocessor<baryonyx::raw_problem> *this)

{
  context *ctx;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  problem_solver_type pVar5;
  size_type __n;
  pointer pvVar6;
  pair<int,_bool> pVar7;
  reference pvVar8;
  const_reference pvVar9;
  reference pvVar10;
  size_t size;
  tuple<double,_baryonyx::show_size_type> *mem;
  bool local_3e9;
  ostream local_390 [8];
  ofstream ofs;
  baryonyx local_190 [16];
  string local_180;
  size_t local_160;
  char *local_158;
  size_t local_150;
  char *local_148;
  int local_140;
  int local_13c;
  int e_1;
  int i_1;
  tuple<baryonyx::variables,_baryonyx::affected_variables> local_128;
  objective_function local_c8;
  int local_8c;
  bool local_85;
  int local_84;
  _Node_iterator_base<std::pair<const_int,_bool>,_false> local_80;
  pair<int,_bool> local_78;
  _Node_iterator_base<std::pair<const_int,_bool>,_false> local_70;
  const_iterator it;
  key_type local_60;
  int e;
  int i;
  int c;
  bool local_45;
  int local_44;
  pair<int,_bool> local_40;
  undefined1 local_38 [8];
  vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> mapping;
  preprocessor<baryonyx::raw_problem> *this_local;
  problem *copy;
  
  mapping.super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  baryonyx::problem::problem(__return_storage_ptr__);
  std::shared_ptr<baryonyx::string_buffer>::operator=
            (&__return_storage_ptr__->strings,&this->pb->strings);
  __return_storage_ptr__->type = this->pb->type;
  __n = std::vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>::size
                  (&(this->pb->vars).values);
  local_44 = -1;
  local_45 = false;
  std::pair<int,_bool>::pair<int,_bool,_true>(&local_40,&local_44,&local_45);
  std::allocator<std::pair<int,_bool>_>::allocator
            ((allocator<std::pair<int,_bool>_> *)((long)&i + 3));
  std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::vector
            ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)local_38,__n,
             &local_40,(allocator<std::pair<int,_bool>_> *)((long)&i + 3));
  std::allocator<std::pair<int,_bool>_>::~allocator
            ((allocator<std::pair<int,_bool>_> *)((long)&i + 3));
  e = 0;
  local_60 = 0;
  it.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur._4_4_ =
       baryonyx::
       length<std::vector<baryonyx::variable_value,std::allocator<baryonyx::variable_value>>>
                 (&(this->pb->vars).values);
  for (; iVar4 = e,
      local_60 != it.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur._4_4_;
      local_60 = local_60 + 1) {
    local_70._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
         ::find(&this->vars,&local_60);
    local_80._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
         ::end(&this->vars);
    bVar1 = std::__detail::operator==(&local_70,&local_80);
    if (bVar1) {
      local_84 = e;
      local_85 = false;
      e = e + 1;
      pVar7 = std::make_pair<int,bool>(&local_84,&local_85);
      local_78.first = pVar7.first;
      local_78.second = pVar7.second;
    }
    else {
      local_8c = -1;
      pvVar6 = std::__detail::_Node_const_iterator<std::pair<const_int,_bool>,_false,_false>::
               operator->((_Node_const_iterator<std::pair<const_int,_bool>,_false,_false> *)
                          &local_70);
      pVar7 = std::make_pair<int,bool_const&>(&local_8c,&pvVar6->second);
      local_78.first = pVar7.first;
      local_78.second = pVar7.second;
    }
    pvVar8 = std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::operator[]
                       ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                        local_38,(long)local_60);
    std::pair<int,_bool>::operator=(pvVar8,&local_78);
  }
  iVar2 = baryonyx::
          length<std::vector<baryonyx::variable_value,std::allocator<baryonyx::variable_value>>>
                    (&(this->pb->vars).values);
  iVar3 = baryonyx::
          length<std::unordered_map<int,bool,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,bool>>>>
                    (&this->vars);
  if (iVar4 != iVar2 - iVar3) {
    baryonyx::details::fail_fast
              ("Assertion","c == bx::length(pb.vars.values) - bx::length(vars)",
               "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/preprocessor.cpp"
               ,"672");
  }
  objective_function_exclude_copy
            (&local_c8,this,
             (vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)local_38);
  baryonyx::objective_function::operator=(&__return_storage_ptr__->objective,&local_c8);
  baryonyx::objective_function::~objective_function(&local_c8);
  variables_exclude_copy(&local_128,this);
  std::tie<baryonyx::variables,baryonyx::affected_variables>
            ((variables *)&e_1,(affected_variables *)&__return_storage_ptr__->vars);
  std::tuple<baryonyx::variables&,baryonyx::affected_variables&>::operator=
            ((tuple<baryonyx::variables&,baryonyx::affected_variables&> *)&e_1,&local_128);
  std::tuple<baryonyx::variables,_baryonyx::affected_variables>::~tuple(&local_128);
  local_13c = 0;
  local_140 = baryonyx::
              length<std::vector<baryonyx::variable_value,std::allocator<baryonyx::variable_value>>>
                        (&(this->pb->vars).values);
  for (; local_13c != local_140; local_13c = local_13c + 1) {
    pvVar8 = std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::operator[]
                       ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                        local_38,(long)local_13c);
    if (-1 < pvVar8->first) {
      pvVar9 = std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::operator[](&(this->pb->vars).names,(long)local_13c);
      local_150 = pvVar9->_M_len;
      local_148 = pvVar9->_M_str;
      pvVar8 = std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::operator[]
                         ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                          local_38,(long)local_13c);
      pvVar10 = std::
                vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::operator[](&(__return_storage_ptr__->vars).names,(long)pvVar8->first);
      local_160 = pvVar10->_M_len;
      local_158 = pvVar10->_M_str;
      __y._M_len = pvVar10->_M_len;
      __y._M_str = pvVar10->_M_str;
      __x._M_str = local_148;
      __x._M_len = local_150;
      bVar1 = std::operator==(__x,__y);
      if (!bVar1) {
        baryonyx::details::fail_fast
                  ("Postcondition","pb.vars.names[i] == copy.vars.names[mapping[i].first]",
                   "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/preprocessor.cpp"
                   ,"680");
      }
    }
  }
  constraints_exclude_copy
            (this,(vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)local_38,
             &this->equal_constraints,&this->pb->equal_constraints,
             &__return_storage_ptr__->equal_constraints);
  constraints_exclude_copy
            (this,(vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)local_38,
             &this->greater_constraints,&this->pb->greater_constraints,
             &__return_storage_ptr__->greater_constraints);
  constraints_exclude_copy
            (this,(vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)local_38,
             &this->less_constraints,&this->pb->less_constraints,
             &__return_storage_ptr__->less_constraints);
  iVar4 = baryonyx::
          length<std::vector<baryonyx::variable_value,std::allocator<baryonyx::variable_value>>>
                    (&(__return_storage_ptr__->vars).values);
  bVar1 = is_valid_variable_index(&__return_storage_ptr__->equal_constraints,iVar4);
  local_3e9 = false;
  if (bVar1) {
    iVar4 = baryonyx::
            length<std::vector<baryonyx::variable_value,std::allocator<baryonyx::variable_value>>>
                      (&(__return_storage_ptr__->vars).values);
    bVar1 = is_valid_variable_index(&__return_storage_ptr__->greater_constraints,iVar4);
    local_3e9 = false;
    if (bVar1) {
      iVar4 = baryonyx::
              length<std::vector<baryonyx::variable_value,std::allocator<baryonyx::variable_value>>>
                        (&(__return_storage_ptr__->vars).values);
      local_3e9 = is_valid_variable_index(&__return_storage_ptr__->less_constraints,iVar4);
    }
  }
  if (local_3e9 != false) {
    pVar5 = baryonyx::problem::which_problem_type(__return_storage_ptr__);
    __return_storage_ptr__->problem_type = pVar5;
    ctx = this->ctx;
    size = baryonyx::memory_consumed(__return_storage_ptr__);
    baryonyx::memory_consumed_size<unsigned_long>(local_190,size);
    baryonyx::to_string_abi_cxx11_(&local_180,local_190,mem);
    baryonyx::info<std::__cxx11::string>(ctx,"- Preprocessing finishes (size: {})\n",&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::ofstream::ofstream(local_390,"preprocessed.lp",_S_out);
    baryonyx::operator<<(local_390,__return_storage_ptr__);
    mapping.super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    std::ofstream::~ofstream(local_390);
    std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::~vector
              ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)local_38);
    if ((mapping.super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
      baryonyx::problem::~problem(__return_storage_ptr__);
    }
    return __return_storage_ptr__;
  }
  baryonyx::details::fail_fast
            ("Postcondition",
             "is_valid_variable_index(copy.equal_constraints, bx::length(copy.vars.values)) && is_valid_variable_index(copy.greater_constraints, bx::length(copy.vars.values)) && is_valid_variable_index(copy.less_constraints, bx::length(copy.vars.values))"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/preprocessor.cpp"
             ,"702");
}

Assistant:

auto make_problem() const -> bx::problem
    {
        bx::problem copy;

        copy.strings = pb.strings;
        copy.type = pb.type;

        // Build the mapping structure between origin variable index and newly
        // variable index in the copy.

        std::vector<std::pair<int, bool>> mapping(pb.vars.values.size(),
                                                  { -1, false });

        int c = 0;
        for (int i = 0, e = bx::length(pb.vars.values); i != e; ++i) {
            auto it = vars.find(i);

            mapping[i] = (it == vars.end()) ? std::make_pair(c++, false)
                                            : std::make_pair(-1, it->second);
        }

        bx_assert(c == bx::length(pb.vars.values) - bx::length(vars));

        copy.objective = objective_function_exclude_copy(mapping);
        std::tie(copy.vars, copy.affected_vars) = variables_exclude_copy();

        for (int i = 0, e = bx::length(pb.vars.values); i != e; ++i) {
            if (mapping[i].first >= 0) {
                bx_ensures(pb.vars.names[i] ==
                           copy.vars.names[mapping[i].first]);
            }
        }

        constraints_exclude_copy(mapping,
                                 equal_constraints,
                                 pb.equal_constraints,
                                 copy.equal_constraints);
        constraints_exclude_copy(mapping,
                                 greater_constraints,
                                 pb.greater_constraints,
                                 copy.greater_constraints);
        constraints_exclude_copy(mapping,
                                 less_constraints,
                                 pb.less_constraints,
                                 copy.less_constraints);

        bx_ensures(is_valid_variable_index(copy.equal_constraints,
                                           bx::length(copy.vars.values)) &&
                   is_valid_variable_index(copy.greater_constraints,
                                           bx::length(copy.vars.values)) &&
                   is_valid_variable_index(copy.less_constraints,
                                           bx::length(copy.vars.values)));

        copy.problem_type = copy.which_problem_type();

        info(ctx,
             "- Preprocessing finishes (size: {})\n",
             to_string(bx::memory_consumed_size(memory_consumed(copy))));

        // #ifdef BARYONYX_ENABLE_DEBUG
        std::ofstream ofs("preprocessed.lp");
        ofs << copy;
        // #endif

        return copy;
    }